

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

MIR_insn_t_conflict MIR_copy_insn(MIR_context_t ctx,MIR_insn_t_conflict insn)

{
  size_t __size;
  MIR_insn_t_conflict __dest;
  MIR_error_func_t p_Var1;
  char *pcVar2;
  uint local_2c;
  MIR_insn_t_conflict new_insn;
  size_t size;
  MIR_insn_t_conflict insn_local;
  MIR_context_t ctx_local;
  
  if (insn != (MIR_insn_t_conflict)0x0) {
    if ((int)((ulong)*(undefined8 *)&insn->field_0x18 >> 0x20) == 0) {
      local_2c = 0;
    }
    else {
      local_2c = (int)((ulong)*(undefined8 *)&insn->field_0x18 >> 0x20) - 1;
    }
    __size = (ulong)local_2c * 0x30 + 0x50;
    __dest = (MIR_insn_t_conflict)malloc(__size);
    if (__dest == (MIR_insn_t_conflict)0x0) {
      p_Var1 = MIR_get_error_func(ctx);
      pcVar2 = insn_name((MIR_insn_code_t)*(undefined8 *)&insn->field_0x18);
      (*p_Var1)(MIR_alloc_error,"Not enough memory to copy insn %s",pcVar2);
    }
    memcpy(__dest,insn,__size);
    return __dest;
  }
  __assert_fail("insn != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                ,0x92b,"MIR_insn_t MIR_copy_insn(MIR_context_t, MIR_insn_t)");
}

Assistant:

MIR_insn_t MIR_copy_insn (MIR_context_t ctx, MIR_insn_t insn) {
  size_t size;
  mir_assert (insn != NULL);
  size = sizeof (struct MIR_insn) + sizeof (MIR_op_t) * (insn->nops == 0 ? 0 : insn->nops - 1);
  MIR_insn_t new_insn = malloc (size);

  if (new_insn == NULL)
    MIR_get_error_func (ctx) (MIR_alloc_error, "Not enough memory to copy insn %s",
                              insn_name (insn->code));
  memcpy (new_insn, insn, size);
  return new_insn;
}